

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_scientific.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::ScientificMatcher::ScientificMatcher
          (ScientificMatcher *this,DecimalFormatSymbols *dfs,Grouper *grouper)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__ScientificMatcher_003ac308;
  UnicodeString::UnicodeString(&this->fExponentSeparatorString,(UnicodeString *)&dfs->field_0x2c8);
  DecimalMatcher::DecimalMatcher(&this->fExponentMatcher,dfs,grouper,0x30);
  (this->fCustomMinusSign).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b5258;
  (this->fCustomMinusSign).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fCustomPlusSign).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b5258;
  (this->fCustomPlusSign).fUnion.fStackFields.fLengthAndFlags = 2;
  pUVar2 = unisets::get(MINUS_SIGN);
  UVar1 = UnicodeSet::contains(pUVar2,(UnicodeString *)&dfs->field_0x188);
  if (UVar1 == '\0') {
    UnicodeString::operator=(&this->fCustomMinusSign,(UnicodeString *)&dfs->field_0x188);
  }
  else {
    UnicodeString::setToBogus(&this->fCustomMinusSign);
  }
  pUVar2 = unisets::get(PLUS_SIGN);
  UVar1 = UnicodeSet::contains(pUVar2,(UnicodeString *)&dfs->field_0x1c8);
  if (UVar1 == '\0') {
    UnicodeString::operator=(&this->fCustomPlusSign,(UnicodeString *)&dfs->field_0x1c8);
  }
  else {
    UnicodeString::setToBogus(&this->fCustomPlusSign);
  }
  return;
}

Assistant:

ScientificMatcher::ScientificMatcher(const DecimalFormatSymbols& dfs, const Grouper& grouper)
        : fExponentSeparatorString(dfs.getConstSymbol(DecimalFormatSymbols::kExponentialSymbol)),
          fExponentMatcher(dfs, grouper, PARSE_FLAG_INTEGER_ONLY | PARSE_FLAG_GROUPING_DISABLED) {

    const UnicodeString& minusSign = dfs.getConstSymbol(DecimalFormatSymbols::kMinusSignSymbol);
    if (minusSignSet().contains(minusSign)) {
        fCustomMinusSign.setToBogus();
    } else {
        fCustomMinusSign = minusSign;
    }

    const UnicodeString& plusSign = dfs.getConstSymbol(DecimalFormatSymbols::kPlusSignSymbol);
    if (plusSignSet().contains(plusSign)) {
        fCustomPlusSign.setToBogus();
    } else {
        fCustomPlusSign = plusSign;
    }
}